

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

size_t propagatemark(global_State *g)

{
  uint *puVar1;
  uint8_t uVar2;
  char cVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  cTValue *pcVar8;
  ulong uVar9;
  char *pcVar10;
  GCtab *t;
  GCfunc *fn;
  GCobj *pGVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  uVar7 = (g->gc).gray.gcptr32;
  fn = (GCfunc *)(ulong)uVar7;
  uVar2 = (fn->c).gct;
  (fn->c).marked = (fn->c).marked | 4;
  (g->gc).gray.gcptr32 = (fn->c).gclist.gcptr32;
  if (uVar2 != '\v') {
    if (uVar2 == '\b') {
      gc_traverse_func(g,fn);
      if ((fn->c).ffid != '\0') {
        return (ulong)(fn->c).nupvalues * 8 + 0x20;
      }
      return (ulong)(fn->c).nupvalues * 4 + 0x14;
    }
    if (uVar2 == '\a') {
      gc_traverse_proto(g,(GCproto *)&fn->c);
      return (ulong)(fn->c).upvalue[0].u32.lo;
    }
    if (uVar2 == '\x06') {
      (fn->c).gclist.gcptr32 = (g->gc).grayagain.gcptr32;
      (g->gc).grayagain.gcptr32 = uVar7;
      (fn->c).marked = (fn->c).marked & 0xfb;
      gc_traverse_thread(g,(lua_State *)&fn->c);
      return (ulong)*(uint *)((long)fn + 0x38) * 8 + 0x40;
    }
    gc_traverse_trace(g,(GCtrace *)&fn->c);
    uVar4._0_1_ = *(uint8_t *)((long)fn + 6);
    uVar4._1_1_ = *(uint8_t *)((long)fn + 7);
    return (ulong)((uint)uVar4 * 0xc) + (ulong)((fn->c).env.gcptr32 - *(int *)&(fn->c).f) * 8 +
           (ulong)*(uint *)((long)&(fn->c).f + 4) * 4 + 0x60;
  }
  pGVar11 = (GCobj *)(ulong)(fn->c).pc.ptr32;
  if (pGVar11 != (GCobj *)0x0) {
    if (((pGVar11->gch).marked & 3) != 0) {
      gc_mark(g,pGVar11);
    }
    if (((pGVar11->gch).unused1 & 8) == 0) {
      pcVar8 = lj_meta_cache(&pGVar11->tab,MM_mode,(GCstr *)(ulong)g->gcroot[3].gcptr32);
      goto LAB_00110ac0;
    }
  }
  pcVar8 = (cTValue *)0x0;
LAB_00110ac0:
  uVar13 = 0;
  if ((pcVar8 != (cTValue *)0x0) && ((pcVar8->field_2).it == 0xfffffffb)) {
    pcVar10 = (char *)((ulong)(pcVar8->u32).lo + 0x10);
    uVar6 = 0;
    while (cVar3 = *pcVar10, cVar3 != '\0') {
      pcVar10 = pcVar10 + 1;
      if (cVar3 == 'v') {
        uVar6 = uVar6 | 0x10;
      }
      else if (cVar3 == 'k') {
        uVar6 = uVar6 | 8;
      }
    }
    if (uVar6 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 0xffffffef;
      if (g->gcroot[0x26].gcptr32 != uVar7) {
        (fn->c).marked = (byte)uVar6 | (fn->c).marked & 0xe7;
        (fn->c).gclist.gcptr32 = (g->gc).weak.gcptr32;
        (g->gc).weak.gcptr32 = uVar7;
        uVar13 = uVar6;
      }
    }
  }
  uVar7 = 1;
  if (uVar13 != 0x18) {
    if (((uVar13 & 0x10) == 0) && (uVar7 = *(uint *)&(fn->c).f, (ulong)uVar7 != 0)) {
      uVar15 = 0;
      do {
        uVar9 = (ulong)(fn->c).env.gcptr32;
        if ((*(int *)(uVar9 + 4 + uVar15 * 8) + 0xdU < 9) &&
           (pGVar11 = (GCobj *)(ulong)*(uint *)(uVar9 + uVar15 * 8),
           ((pGVar11->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar11);
        }
        uVar15 = uVar15 + 1;
      } while (uVar7 != uVar15);
    }
    uVar6 = *(uint *)((long)&(fn->c).f + 4);
    uVar7 = uVar13;
    if (uVar6 != 0) {
      uVar9 = (ulong)(fn->l).uvptr[0].gcptr32;
      uVar15 = 0;
      do {
        if (*(int *)(uVar9 + 4 + uVar15 * 0x18) != -1) {
          puVar1 = (uint *)(uVar9 + uVar15 * 0x18);
          if ((((uVar13 & 8) == 0) && (puVar1[3] + 0xd < 9)) &&
             (((((GCobj *)(ulong)puVar1[2])->gch).marked & 3) != 0)) {
            gc_mark(g,(GCobj *)(ulong)puVar1[2]);
          }
          if ((((uVar13 & 0x10) == 0) && (puVar1[1] + 0xd < 9)) &&
             (((((GCobj *)(ulong)*puVar1)->gch).marked & 3) != 0)) {
            gc_mark(g,(GCobj *)(ulong)*puVar1);
          }
        }
        uVar14 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar14;
      } while (uVar14 <= uVar6);
    }
  }
  if (0 < (int)uVar7) {
    (fn->c).marked = (fn->c).marked & 0xfb;
  }
  iVar5 = *(int *)((long)&(fn->c).f + 4);
  lVar12 = 0;
  if (iVar5 != 0) {
    lVar12 = (ulong)(iVar5 + 1) * 0x18;
  }
  return lVar12 + (ulong)*(uint *)&(fn->c).f * 8 + 0x20;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lj_assertG(isgray(o), "propagation of non-gray object");
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   (t->hmask ? sizeof(Node) * (t->hmask + 1) : 0);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lj_assertG(0, "bad GC type %d", gct);
    return 0;
#endif
  }
}